

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O0

void reoProfileNodesStart(reo_man *p)

{
  int local_18;
  int local_14;
  int i;
  int Total;
  reo_man *p_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 <= p->nSupp; local_18 = local_18 + 1) {
    p->pPlanes[local_18].statsCost = (double)p->pPlanes[local_18].statsNodes;
    local_14 = p->pPlanes[local_18].statsNodes + local_14;
  }
  if (local_14 == p->nNodesCur) {
    p->nNodesBeg = p->nNodesCur;
    return;
  }
  __assert_fail("Total == p->nNodesCur",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/reo/reoProfile.c"
                ,0x37,"void reoProfileNodesStart(reo_man *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////


////////////////////////////////////////////////////////////////////////
///                    FUNCTION DEFINITIONS                          ///
////////////////////////////////////////////////////////////////////////


/**Function********************************************************************

  Synopsis    [Start the profile for the BDD nodes.]

  Description [TopRef is the first level, on this the given node counts towards 
  the width of the BDDs. (In other words, it is the level of the referencing node plus 1.)]

  SideEffects []

  SeeAlso     []

******************************************************************************/
void reoProfileNodesStart( reo_man * p )
{
	int Total, i;
	Total = 0;
	for ( i = 0; i <= p->nSupp; i++ )
	{
		p->pPlanes[i].statsCost = p->pPlanes[i].statsNodes;
		Total += p->pPlanes[i].statsNodes;
	}
	assert( Total == p->nNodesCur );
	p->nNodesBeg = p->nNodesCur;
}